

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O3

Accel * __thiscall
embree::BVH4Factory::BVH4Quad4i
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  long lVar1;
  int iVar2;
  BVHN<4> *this_00;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  Intersectors intersectors;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors local_140;
  
  this_00 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&QuadMi<4>::type,scene);
  BVH4Quad4iIntersectors(&local_140,this,this_00,ivariant);
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
  if (iVar2 == 0) {
    if (bvariant != STATIC) {
      pBVar3 = (Builder *)0x0;
      goto LAB_00b91e92;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
    if (iVar2 != 0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&local_160,"unknown builder ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
      plVar8 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (plVar8 == plVar7) {
        local_170 = *plVar7;
        uStack_168 = (undefined4)plVar6[3];
        uStack_164 = *(undefined4 *)((long)plVar6 + 0x1c);
        plVar8 = &local_170;
      }
      else {
        local_170 = *plVar7;
      }
      lVar1 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      *puVar5 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar5 + 1) = 2;
      puVar5[2] = puVar5 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 2),plVar8,lVar1 + (long)plVar8);
      __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  pBVar3 = (*this->BVH4Quad4iSceneBuilderSAH)(this_00,scene,0);
LAB_00b91e92:
  pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
  memcpy(&(pAVar4->super_AccelData).field_0x58,&local_140,0x118);
  (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_0218ab40;
  pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar3;
  return pAVar4;
}

Assistant:

Accel* BVH4Factory::BVH4Quad4i(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Quad4i::type,scene);
    Accel::Intersectors intersectors = BVH4Quad4iIntersectors(accel,ivariant);

    Builder* builder = nullptr;
    if (scene->device->quad_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Quad4iSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : assert(false); break; // FIXME: implement
      case BuildVariant::HIGH_QUALITY: assert(false); break; // FIXME: implement
      }
    }
    else if (scene->device->quad_builder == "sah") builder = BVH4Quad4iSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->quad_builder+" for BVH4<Quad4i>");

    return new AccelInstance(accel,builder,intersectors);
  }